

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_loop.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseFor(Parser *this,bool isdo)

{
  byte bVar1;
  bool bVar2;
  Token *pTVar3;
  pointer this_00;
  Position *pos_00;
  byte in_DL;
  undefined7 in_register_00000031;
  Parser *this_01;
  undefined1 local_e4 [20];
  Position pos;
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  undefined1 local_78 [8];
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  undefined1 local_58 [24];
  undefined1 local_40 [8];
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> local_38;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> itExpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> condExpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> initExpr;
  bool isdo_local;
  Parser *this_local;
  
  this_01 = (Parser *)CONCAT71(in_register_00000031,isdo);
  bVar1 = in_DL & 1;
  if (bVar1 == 0) {
    sanityExpect(this_01,TOK_KW_FOR);
  }
  else {
    sanityExpect(this_01,TOK_KW_DO);
  }
  std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
  unique_ptr<std::default_delete<pfederc::Expr>,void>
            ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)&condExpr);
  std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
  unique_ptr<std::default_delete<pfederc::Expr>,void>
            ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)&itExpr);
  std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
  unique_ptr<std::default_delete<pfederc::Expr>,void>
            ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)&local_38);
  if (bVar1 == 0) {
    parseExpression((Parser *)(local_58 + 0x10),isdo);
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
              (&itExpr,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                       (local_58 + 0x10));
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_58 + 0x10));
    bVar2 = expect(this_01,TOK_STMT);
    if (bVar2) {
      skipEol(this_01);
      parseExpression((Parser *)(local_58 + 8),isdo);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_38,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_58 + 8));
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_58 + 8));
      bVar2 = expect(this_01,TOK_STMT);
      if (bVar2) {
        skipEol(this_01);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                  (&condExpr,&itExpr);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                  (&itExpr,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                           &local_38);
        parseExpression((Parser *)local_58,isdo);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_38,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_58);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_58);
      }
    }
  }
  else {
    pTVar3 = Lexer::getCurrentToken(this_01->lexer);
    bVar2 = Token::operator!=(pTVar3,TOK_EOL);
    if (bVar2) {
      pTVar3 = Lexer::getCurrentToken(this_01->lexer);
      bVar2 = Token::operator!=(pTVar3,TOK_EOF);
      if (bVar2) {
        parseExpression((Parser *)local_40,isdo);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                  (&condExpr,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_40);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_40);
      }
    }
  }
  bVar2 = expect(this_01,TOK_EOL);
  if (!bVar2) {
    bodyExpr._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._6_2_ = 2;
    bodyExpr._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._0_4_ = 0xf;
    pTVar3 = Lexer::getCurrentToken(this_01->lexer);
    Token::getPosition(pTVar3);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&stack0xffffffffffffff98,
               (SyntaxErrorCode *)
               ((long)&bodyExpr._M_t.
                       super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                       .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 6),
               (Position *)&bodyExpr);
    generateError((Parser *)&stack0xffffffffffffffa0,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_01);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffa0);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&stack0xffffffffffffff98);
    skipToEol(this_01);
  }
  parseFunctionBody((Parser *)local_78);
  bVar2 = expect(this_01,TOK_STMT);
  if (!bVar2) {
    local_90._6_2_ = 2;
    local_90._0_4_ = 0xf;
    pTVar3 = Lexer::getCurrentToken(this_01->lexer);
    Token::getPosition(pTVar3);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_90 + 8),(SyntaxErrorCode *)(local_90 + 6),(Position *)local_90);
    generateError((Parser *)(local_90 + 0x10),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_01);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_90 + 0x10));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_90 + 8));
  }
  if (bVar1 != 0) {
    bVar2 = expect(this_01,TOK_KW_FOR);
    if (bVar2) {
      parseExpression((Parser *)(local_b8 + 8),isdo);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                (&itExpr,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                         (local_b8 + 8));
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_b8 + 8));
      bVar2 = expect(this_01,TOK_STMT);
      if (bVar2) {
        skipEol(this_01);
        parseExpression((Parser *)local_b8,isdo);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_38,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_b8);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_b8);
      }
    }
    else {
      local_a8._6_2_ = 2;
      local_a8._0_4_ = 0x20;
      pTVar3 = Lexer::getCurrentToken(this_01->lexer);
      Token::getPosition(pTVar3);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_a8 + 8),(SyntaxErrorCode *)(local_a8 + 6),(Position *)local_a8);
      generateError((Parser *)(local_a8 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this_01);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_a8 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_a8 + 8));
      skipToEol(this_01);
    }
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&itExpr);
  if ((bVar2) && (bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_78), bVar2)) {
    this_00 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                        (&itExpr);
    pos_00 = Expr::getPosition(this_00);
    Position::Position((Position *)(local_e4 + 0xc),pos_00);
    local_e4._0_4_ = bVar1 + 0xf;
    std::
    make_unique<pfederc::LoopExpr,pfederc::Lexer&,pfederc::ExprType,pfederc::Position&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
              ((Lexer *)(local_e4 + 4),(ExprType *)this_01->lexer,(Position *)local_e4,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_e4 + 0xc),
               &condExpr,&itExpr,&local_38);
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<pfederc::LoopExpr,std::default_delete<pfederc::LoopExpr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
               (unique_ptr<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_> *)
               (local_e4 + 4));
    std::unique_ptr<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_> *)
               (local_e4 + 4));
  }
  else {
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0);
  }
  pos.endIndex._4_4_ = 1;
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_78);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_38);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&itExpr);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&condExpr);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseFor(bool isdo) noexcept {
  if (isdo)
    sanityExpect(TokenType::TOK_KW_DO);
  else
    sanityExpect(TokenType::TOK_KW_FOR);

  std::unique_ptr<Expr> initExpr, condExpr, itExpr;

  if (isdo) {
    if (*lexer.getCurrentToken() != TokenType::TOK_EOL
        && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
      initExpr = parseExpression();
    }
  } else {
    condExpr = parseExpression();
    if (expect(TokenType::TOK_STMT)) {
      skipEol();
      itExpr = parseExpression();
      if (expect(TokenType::TOK_STMT)) {
        skipEol();
        // switch expressions
        initExpr = std::move(condExpr);
        condExpr = std::move(itExpr);
        itExpr = parseExpression();
      }
    }
  }

  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL,
          lexer.getCurrentToken()->getPosition()));
    skipToEol();
  }
  // parse body
  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL,
          lexer.getCurrentToken()->getPosition()));
  }

  if (isdo) {
    if (!expect(TokenType::TOK_KW_FOR)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_FOR,
            lexer.getCurrentToken()->getPosition()));
      skipToEol();
    } else {
      condExpr = parseExpression();
      if (expect(TokenType::TOK_STMT)) {
        skipEol();
        itExpr = parseExpression();
      }
    }
  }

  if (!condExpr || !bodyExpr)
    return nullptr;

  Position pos = condExpr->getPosition();

  return std::make_unique<LoopExpr>(lexer,
      isdo ? ExprType::EXPR_LOOP_DO : ExprType::EXPR_LOOP_FOR, pos,
      std::move(initExpr), std::move(condExpr), std::move(itExpr),
      std::move(bodyExpr));
}